

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void basic_suite::test_true(void)

{
  bool value;
  undefined1 local_aa;
  value_type input [1];
  iarchive in;
  
  input[0] = 0x81;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[1]>(&in,&input);
  value = false;
  trial::protocol::bintoken::iarchive::load<bool>(&in,&value);
  local_aa = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x2b,"void basic_suite::test_true()",&value,&local_aa);
  trial::protocol::bintoken::iarchive::~iarchive(&in);
  return;
}

Assistant:

void test_true()
{
    const value_type input[] = { token::code::true_value };
    format::iarchive in(input);
    bool value = false;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, true);
}